

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O3

llb_build_value * llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo)

{
  BuildValue *this;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  uint64_t in_stack_00000030;
  BuildValue local_80;
  
  this = (BuildValue *)operator_new(0x70);
  if ((((in_stack_00000018 != 0 || in_stack_00000020 != 0) ||
       (in_stack_00000008 != 0 || in_stack_00000010 != 0)) || in_stack_00000028 != 0) ||
      in_stack_00000030 != 0) {
    local_80.kind = ExistingInput;
    local_80.numOutputInfos = 1;
    local_80.signature.value = 0;
    local_80.stringValues.contents = (char *)0x0;
    local_80.stringValues.size = 0;
    local_80.valueData.asOutputInfo.modTime.nanoseconds = in_stack_00000030;
    local_80.valueData._48_8_ = 0;
    local_80.valueData._56_8_ = 0;
    local_80.valueData._64_8_ = 0;
    local_80.valueData._72_8_ = 0;
    llbuild::buildsystem::BuildValue::BuildValue(this,&local_80);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
    return (llb_build_value *)this;
  }
  __assert_fail("!outputInfo.isMissing()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0x113,
                "static BuildValue llbuild::buildsystem::BuildValue::makeExistingInput(FileInfo)");
}

Assistant:

llb_build_value *llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo) {
  return (llb_build_value *)new CAPIBuildValue(BuildValue::makeExistingInput(convertFileInfo(fileInfo)));
}